

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O0

void __thiscall
TxRequestTracker::Impl::RequestedTx(Impl *this,NodeId peer,uint256 *txhash,microseconds expiry)

{
  long lVar1;
  bool bVar2;
  State SVar3;
  ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *this_00;
  base_blob<256U> *b;
  iterator iVar4;
  Impl *in_RDI;
  long in_FS_OFFSET;
  iterator it_old;
  iterator it;
  Announcement *in_stack_fffffffffffffee8;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
  *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffeff;
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *in_stack_ffffffffffffff00;
  bool local_f1;
  Impl *in_stack_ffffffffffffff20;
  Iter<(anonymous_namespace)::ByPeer> in_stack_ffffffffffffff48;
  anon_class_8_1_544cee71 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  boost::multi_index::
  multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
  ::get<(anonymous_namespace)::ByPeer>
            ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
              *)in_stack_fffffffffffffee8);
  std::tuple<long,_bool,_const_uint256_&>::tuple<long_&,_bool,_const_uint256_&,_true,_true>
            ((tuple<long,_bool,_const_uint256_&> *)
             CONCAT17(in_stack_fffffffffffffeff,
                      CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
             (long *)in_stack_fffffffffffffef0,(bool *)in_stack_fffffffffffffee8,
             (uint256 *)0x1481798);
  local_20.expiry.__r =
       (microseconds)
       boost::multi_index::detail::
       ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
       ::find<std::tuple<long,bool,uint256_const&>>
                 (in_stack_ffffffffffffff00,
                  (tuple<long,_bool,_const_uint256_&> *)
                  CONCAT17(in_stack_fffffffffffffeff,
                           CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  boost::multi_index::
  multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
  ::get<(anonymous_namespace)::ByPeer>
            ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
              *)in_stack_fffffffffffffee8);
  boost::multi_index::detail::
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  ::end(in_stack_ffffffffffffff00);
  bVar2 = boost::multi_index::detail::operator==
                    ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeff,
                                 CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                     in_stack_fffffffffffffef0);
  if (bVar2) {
    this_00 = (ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
               *)boost::multi_index::
                 multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                 ::get<(anonymous_namespace)::ByPeer>
                           ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                             *)in_stack_fffffffffffffee8);
    std::tuple<long,_bool,_const_uint256_&>::tuple<long_&,_bool,_const_uint256_&,_true,_true>
              ((tuple<long,_bool,_const_uint256_&> *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
               (long *)in_stack_fffffffffffffef0,(bool *)in_stack_fffffffffffffee8,
               (uint256 *)0x148182b);
    local_20.expiry.__r =
         (microseconds)
         boost::multi_index::detail::
         ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
         ::find<std::tuple<long,bool,uint256_const&>>
                   ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                     *)this_00,
                    (tuple<long,_bool,_const_uint256_&> *)
                    CONCAT17(in_stack_fffffffffffffeff,
                             CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    boost::multi_index::
    multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
    ::get<(anonymous_namespace)::ByPeer>
              ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                *)in_stack_fffffffffffffee8);
    boost::multi_index::detail::
    ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
    ::end((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
           *)this_00);
    bVar2 = boost::multi_index::detail::operator==
                      ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffeff,
                                   CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                       in_stack_fffffffffffffef0);
    local_f1 = true;
    if (!bVar2) {
      boost::operators_impl::
      dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
      ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                    *)in_stack_fffffffffffffee8);
      SVar3 = anon_unknown.dwarf_237ecec::Announcement::GetState(in_stack_fffffffffffffee8);
      in_stack_fffffffffffffeff = false;
      local_f1 = (bool)in_stack_fffffffffffffeff;
      if (SVar3 != CANDIDATE_DELAYED) {
        boost::operators_impl::
        dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
        ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                      *)in_stack_fffffffffffffee8);
        SVar3 = anon_unknown.dwarf_237ecec::Announcement::GetState(in_stack_fffffffffffffee8);
        in_stack_fffffffffffffeff = SVar3 != CANDIDATE_READY;
        local_f1 = (bool)in_stack_fffffffffffffeff;
      }
    }
    if (local_f1 != false) goto LAB_01481a46;
    b = (base_blob<256U> *)
        boost::multi_index::
        multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
        ::get<(anonymous_namespace)::ByTxHash>
                  ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                    *)in_stack_fffffffffffffee8);
    std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>::
    tuple<const_uint256_&,_(anonymous_namespace)::State,_int,_true,_true>
              ((tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long> *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),(uint256 *)b,
               (State *)in_stack_fffffffffffffee8,(int *)0x1481928);
    iVar4 = boost::multi_index::detail::
            ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,std::less<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>,boost::multi_index::detail::nth_layer<2,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByTxHash,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
            ::lower_bound<std::tuple<uint256_const&,(anonymous_namespace)::State,unsigned_long>>
                      (this_00,(tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>
                                *)CONCAT17(in_stack_fffffffffffffeff,
                                           CONCAT16(in_stack_fffffffffffffefe,
                                                    in_stack_fffffffffffffef8)));
    boost::multi_index::
    multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
    ::get<(anonymous_namespace)::ByTxHash>
              ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                *)in_stack_fffffffffffffee8);
    boost::multi_index::detail::
    ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
    ::end(this_00);
    bVar2 = boost::operators_impl::operator!=
                      ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffeff,
                                   CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                       (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                        *)b);
    uVar5 = false;
    if (bVar2) {
      boost::operators_impl::
      dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
      ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                    *)in_stack_fffffffffffffee8);
      uVar5 = ::operator==((base_blob<256U> *)
                           CONCAT17(in_stack_fffffffffffffeff,
                                    CONCAT16(uVar5,in_stack_fffffffffffffef8)),b);
    }
    if ((bool)uVar5 != false) {
      boost::operators_impl::
      dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
      ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                    *)in_stack_fffffffffffffee8);
      SVar3 = anon_unknown.dwarf_237ecec::Announcement::GetState(in_stack_fffffffffffffee8);
      if (SVar3 == CANDIDATE_BEST) {
        Modify<(anonymous_namespace)::ByTxHash,TxRequestTracker::Impl::RequestedTx(long,uint256_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda((anonymous_namespace)::Announcement&)_1_>
                  (in_RDI,iVar4.node);
      }
      else {
        boost::operators_impl::
        dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
        ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                      *)in_stack_fffffffffffffee8);
        SVar3 = anon_unknown.dwarf_237ecec::Announcement::GetState(in_stack_fffffffffffffee8);
        if (SVar3 == REQUESTED) {
          Modify<(anonymous_namespace)::ByTxHash,TxRequestTracker::Impl::RequestedTx(long,uint256_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda((anonymous_namespace)::Announcement&)_2_>
                    (in_RDI,iVar4.node);
          in_stack_ffffffffffffff48.node =
               (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                *)iVar4.node;
        }
      }
    }
  }
  Modify<(anonymous_namespace)::ByPeer,TxRequestTracker::Impl::RequestedTx(long,uint256_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda((anonymous_namespace)::Announcement&)_3_>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff48,local_20);
LAB_01481a46:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RequestedTx(NodeId peer, const uint256& txhash, std::chrono::microseconds expiry)
    {
        auto it = m_index.get<ByPeer>().find(ByPeerView{peer, true, txhash});
        if (it == m_index.get<ByPeer>().end()) {
            // There is no CANDIDATE_BEST announcement, look for a _READY or _DELAYED instead. If the caller only
            // ever invokes RequestedTx with the values returned by GetRequestable, and no other non-const functions
            // other than ForgetTxHash and GetRequestable in between, this branch will never execute (as txhashes
            // returned by GetRequestable always correspond to CANDIDATE_BEST announcements).

            it = m_index.get<ByPeer>().find(ByPeerView{peer, false, txhash});
            if (it == m_index.get<ByPeer>().end() || (it->GetState() != State::CANDIDATE_DELAYED &&
                                                      it->GetState() != State::CANDIDATE_READY)) {
                // There is no CANDIDATE announcement tracked for this peer, so we have nothing to do. Either this
                // txhash wasn't tracked at all (and the caller should have called ReceivedInv), or it was already
                // requested and/or completed for other reasons and this is just a superfluous RequestedTx call.
                return;
            }

            // Look for an existing CANDIDATE_BEST or REQUESTED with the same txhash. We only need to do this if the
            // found announcement had a different state than CANDIDATE_BEST. If it did, invariants guarantee that no
            // other CANDIDATE_BEST or REQUESTED can exist.
            auto it_old = m_index.get<ByTxHash>().lower_bound(ByTxHashView{txhash, State::CANDIDATE_BEST, 0});
            if (it_old != m_index.get<ByTxHash>().end() && it_old->m_txhash == txhash) {
                if (it_old->GetState() == State::CANDIDATE_BEST) {
                    // The data structure's invariants require that there can be at most one CANDIDATE_BEST or one
                    // REQUESTED announcement per txhash (but not both simultaneously), so we have to convert any
                    // existing CANDIDATE_BEST to another CANDIDATE_* when constructing another REQUESTED.
                    // It doesn't matter whether we pick CANDIDATE_READY or _DELAYED here, as SetTimePoint()
                    // will correct it at GetRequestable() time. If time only goes forward, it will always be
                    // _READY, so pick that to avoid extra work in SetTimePoint().
                    Modify<ByTxHash>(it_old, [](Announcement& ann) { ann.SetState(State::CANDIDATE_READY); });
                } else if (it_old->GetState() == State::REQUESTED) {
                    // As we're no longer waiting for a response to the previous REQUESTED announcement, convert it
                    // to COMPLETED. This also helps guaranteeing progress.
                    Modify<ByTxHash>(it_old, [](Announcement& ann) { ann.SetState(State::COMPLETED); });
                }
            }
        }

        Modify<ByPeer>(it, [expiry](Announcement& ann) {
            ann.SetState(State::REQUESTED);
            ann.m_time = expiry;
        });
    }